

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedTestTest.cpp
# Opt level: O0

string * __thiscall
NamedTestText::asString_abi_cxx11_(string *__return_storage_ptr__,NamedTestText *this)

{
  element_type *peVar1;
  unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> local_48;
  shared_ptr<const_oout::Result> local_40;
  XmlReportText local_30;
  NamedTestText *local_18;
  NamedTestText *this_local;
  
  local_18 = this;
  this_local = (NamedTestText *)__return_storage_ptr__;
  peVar1 = std::__shared_ptr_access<const_oout::Test,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_oout::Test,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->test);
  (*peVar1->_vptr_Test[2])();
  std::shared_ptr<oout::Result_const>::
  shared_ptr<oout::Result_const,std::default_delete<oout::Result_const>,void>
            ((shared_ptr<oout::Result_const> *)&local_40,&local_48);
  oout::XmlReportText::XmlReportText(&local_30,&local_40);
  oout::XmlReportText::asString_abi_cxx11_(__return_storage_ptr__,&local_30);
  oout::XmlReportText::~XmlReportText(&local_30);
  std::shared_ptr<const_oout::Result>::~shared_ptr(&local_40);
  std::unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_>::~unique_ptr
            (&local_48);
  return __return_storage_ptr__;
}

Assistant:

string asString() const override
	{
		return XmlReportText(test->result()).asString();
	}